

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_10.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementTetraCorot_10::ComputeNF
          (ChElementTetraCorot_10 *this,double U,double V,double W,ChVectorDynamic<> *Qi,
          double *detJ,ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  ulong uVar1;
  ulong uVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar8 [64];
  undefined1 in_register_00001248 [56];
  undefined1 auVar9 [64];
  undefined8 in_XMM2_Qb;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  auVar9._8_56_ = in_register_00001248;
  auVar9._0_8_ = V;
  auVar8._8_56_ = in_register_00001208;
  auVar8._0_8_ = U;
  *detJ = this->Volume * 6.0;
  uVar1 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (0 < (long)uVar1) {
    uVar2 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    if (0 < (long)uVar2) {
      auVar12 = ZEXT816(0x4000000000000000);
      auVar11 = ZEXT816(0xbff0000000000000);
      pdVar3 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      pdVar4 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      dVar6 = ((1.0 - U) - V) - W;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = dVar6;
      auVar10 = vfmadd213sd_fma(auVar12,auVar10,auVar11);
      dVar5 = dVar6 * auVar10._0_8_;
      *pdVar4 = dVar5 * *pdVar3;
      if (uVar1 == 1) goto LAB_006ac39f;
      if (uVar2 != 1) {
        pdVar4[1] = dVar5 * pdVar3[1];
        if (uVar1 < 3) goto LAB_006ac39f;
        if ((2 < uVar2) && (pdVar4[2] = dVar5 * pdVar3[2], uVar2 != 3)) {
          auVar10 = vfmadd213sd_fma(auVar12,auVar8._0_16_,auVar11);
          dVar5 = auVar10._0_8_ * U;
          pdVar4[3] = dVar5 * *pdVar3;
          if ((4 < uVar2) &&
             ((pdVar4[4] = dVar5 * pdVar3[1], uVar2 != 5 &&
              (pdVar4[5] = dVar5 * pdVar3[2], 6 < uVar2)))) {
            auVar10 = vfmadd213sd_fma(auVar12,auVar9._0_16_,auVar11);
            dVar5 = auVar10._0_8_ * V;
            pdVar4[6] = dVar5 * *pdVar3;
            if ((uVar2 != 7) &&
               ((pdVar4[7] = dVar5 * pdVar3[1], 8 < uVar2 &&
                (pdVar4[8] = dVar5 * pdVar3[2], uVar2 != 9)))) {
              auVar7._8_8_ = in_XMM2_Qb;
              auVar7._0_8_ = W;
              auVar10 = vfmadd213sd_fma(auVar12,auVar7,auVar11);
              dVar5 = auVar10._0_8_ * W;
              pdVar4[9] = dVar5 * *pdVar3;
              if ((10 < uVar2) &&
                 ((pdVar4[10] = dVar5 * pdVar3[1], uVar2 != 0xb &&
                  (pdVar4[0xb] = dVar5 * pdVar3[2], 0xc < uVar2)))) {
                dVar5 = dVar6 * 4.0 * U;
                pdVar4[0xc] = dVar5 * *pdVar3;
                if ((uVar2 != 0xd) &&
                   ((pdVar4[0xd] = dVar5 * pdVar3[1], 0xe < uVar2 &&
                    (pdVar4[0xe] = dVar5 * pdVar3[2], uVar2 != 0xf)))) {
                  dVar5 = U * 4.0 * V;
                  pdVar4[0xf] = dVar5 * *pdVar3;
                  if ((0x10 < uVar2) &&
                     ((pdVar4[0x10] = dVar5 * pdVar3[1], uVar2 != 0x11 &&
                      (pdVar4[0x11] = dVar5 * pdVar3[2], 0x12 < uVar2)))) {
                    dVar5 = V * 4.0 * dVar6;
                    pdVar4[0x12] = dVar5 * *pdVar3;
                    if ((uVar2 != 0x13) &&
                       ((pdVar4[0x13] = dVar5 * pdVar3[1], 0x14 < uVar2 &&
                        (pdVar4[0x14] = dVar5 * pdVar3[2], uVar2 != 0x15)))) {
                      dVar5 = dVar6 * 4.0 * W;
                      pdVar4[0x15] = dVar5 * *pdVar3;
                      if ((0x16 < uVar2) &&
                         ((pdVar4[0x16] = dVar5 * pdVar3[1], uVar2 != 0x17 &&
                          (pdVar4[0x17] = dVar5 * pdVar3[2], 0x18 < uVar2)))) {
                        dVar5 = U * 4.0 * W;
                        pdVar4[0x18] = dVar5 * *pdVar3;
                        if ((uVar2 != 0x19) &&
                           ((pdVar4[0x19] = dVar5 * pdVar3[1], 0x1a < uVar2 &&
                            (pdVar4[0x1a] = dVar5 * pdVar3[2], uVar2 != 0x1b)))) {
                          dVar5 = V * 4.0 * W;
                          pdVar4[0x1b] = dVar5 * *pdVar3;
                          if ((0x1c < uVar2) && (pdVar4[0x1c] = dVar5 * pdVar3[1], uVar2 != 0x1d)) {
                            pdVar4[0x1d] = dVar5 * pdVar3[2];
                            return;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
LAB_006ac39f:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

void ChElementTetraCorot_10::ComputeNF(const double U,
                                       const double V,
                                       const double W,
                                       ChVectorDynamic<>& Qi,
                                       double& detJ,
                                       const ChVectorDynamic<>& F,
                                       ChVectorDynamic<>* state_x,
                                       ChVectorDynamic<>* state_w) {
    // evaluate shape functions (in compressed vector), btw. not dependant on state
    // note: U,V,W in 0..1 range, thanks to IsTetrahedronIntegrationNeeded() {return true;}
    ShapeVector N;
    ShapeFunctions(N, U, V, W);

    detJ = 6 * this->GetVolume();

    Qi(0) = N(0) * F(0);
    Qi(1) = N(0) * F(1);
    Qi(2) = N(0) * F(2);
    Qi(3) = N(1) * F(0);
    Qi(4) = N(1) * F(1);
    Qi(5) = N(1) * F(2);
    Qi(6) = N(2) * F(0);
    Qi(7) = N(2) * F(1);
    Qi(8) = N(2) * F(2);
    Qi(9) = N(3) * F(0);
    Qi(10) = N(3) * F(1);
    Qi(11) = N(3) * F(2);
    Qi(12) = N(4) * F(0);
    Qi(13) = N(4) * F(1);
    Qi(14) = N(4) * F(2);
    Qi(15) = N(5) * F(0);
    Qi(16) = N(5) * F(1);
    Qi(17) = N(5) * F(2);
    Qi(18) = N(6) * F(0);
    Qi(19) = N(6) * F(1);
    Qi(20) = N(6) * F(2);
    Qi(21) = N(7) * F(0);
    Qi(22) = N(7) * F(1);
    Qi(23) = N(7) * F(2);
    Qi(24) = N(8) * F(0);
    Qi(25) = N(8) * F(1);
    Qi(26) = N(8) * F(2);
    Qi(27) = N(9) * F(0);
    Qi(28) = N(9) * F(1);
    Qi(29) = N(9) * F(2);
}